

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O3

int ssl_parse_supported_elliptic_curves(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  mbedtls_ssl_handshake_params *pmVar1;
  ulong uVar2;
  mbedtls_ecp_curve_info **ppmVar3;
  mbedtls_ecp_curve_info *pmVar4;
  int line;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  uVar5 = (ulong)buf[1];
  if (((buf[1] & 1) == 0) && (lVar6 = (ulong)*buf * 0x100, uVar5 + lVar6 + 2 == len)) {
    pmVar1 = ssl->handshake;
    if (pmVar1->curves == (mbedtls_ecp_curve_info **)0x0) {
      uVar2 = uVar5 + lVar6 >> 1;
      uVar8 = 0xb;
      if (uVar2 < 0xb) {
        uVar8 = uVar2;
      }
      uVar8 = uVar8 + 1;
      ppmVar3 = (mbedtls_ecp_curve_info **)calloc(uVar8,8);
      if (ppmVar3 != (mbedtls_ecp_curve_info **)0x0) {
        pmVar1->curves = ppmVar3;
        if (uVar5 + lVar6 == 0) {
          return 0;
        }
        lVar7 = 0;
        while( true ) {
          pmVar4 = mbedtls_ecp_curve_info_from_tls_id
                             (*(ushort *)(buf + lVar7 + 2) << 8 | *(ushort *)(buf + lVar7 + 2) >> 8)
          ;
          if (pmVar4 != (mbedtls_ecp_curve_info *)0x0) {
            *ppmVar3 = pmVar4;
            ppmVar3 = ppmVar3 + 1;
            uVar8 = uVar8 - 1;
          }
          if (uVar5 + lVar6 + -2 == lVar7) break;
          lVar7 = lVar7 + 2;
          if (uVar8 < 2) {
            return 0;
          }
        }
        return 0;
      }
      return -0x7f00;
    }
    line = 0x100;
  }
  else {
    line = 0xf9;
  }
  mbedtls_debug_print_msg
            (ssl,1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Dragonchang[P]https_client/mbedtls/library/ssl_srv.c"
             ,line,"bad client hello message");
  return -0x7900;
}

Assistant:

static int ssl_parse_supported_elliptic_curves( mbedtls_ssl_context *ssl,
                                                const unsigned char *buf,
                                                size_t len )
{
    size_t list_size, our_size;
    const unsigned char *p;
    const mbedtls_ecp_curve_info *curve_info, **curves;

    list_size = ( ( buf[0] << 8 ) | ( buf[1] ) );
    if( list_size + 2 != len ||
        list_size % 2 != 0 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Should never happen unless client duplicates the extension */
    if( ssl->handshake->curves != NULL )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client hello message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
    }

    /* Don't allow our peer to make us allocate too much memory,
     * and leave room for a final 0 */
    our_size = list_size / 2 + 1;
    if( our_size > MBEDTLS_ECP_DP_MAX )
        our_size = MBEDTLS_ECP_DP_MAX;

    if( ( curves = mbedtls_calloc( our_size, sizeof( *curves ) ) ) == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    ssl->handshake->curves = curves;

    p = buf + 2;
    while( list_size > 0 && our_size > 1 )
    {
        curve_info = mbedtls_ecp_curve_info_from_tls_id( ( p[0] << 8 ) | p[1] );

        if( curve_info != NULL )
        {
            *curves++ = curve_info;
            our_size--;
        }

        list_size -= 2;
        p += 2;
    }

    return( 0 );
}